

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device7.c
# Opt level: O3

void device5(void *arg)

{
  int line;
  int line_00;
  int iVar1;
  int in_ECX;
  undefined4 in_register_0000000c;
  int sock;
  int sock_00;
  
  line = test_socket_impl((char *)0x2e,2,0x31,in_ECX);
  test_bind_impl((char *)0x2f,line,0x104100,(char *)CONCAT44(in_register_0000000c,in_ECX));
  line_00 = test_socket_impl((char *)0x30,2,0x30,in_ECX);
  test_bind_impl((char *)0x31,line_00,0x102176,(char *)CONCAT44(in_register_0000000c,in_ECX));
  iVar1 = nn_device(line,line_00);
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    if (iVar1 == 0x9523dfd) {
      test_close_impl((char *)0x38,line,sock);
      test_close_impl((char *)0x39,line_00,sock_00);
      return;
    }
  }
  device5_cold_1();
}

Assistant:

void device5 (NN_UNUSED void *arg)
{
    int rc;
    int dev0;
    int dev1;

    /*  Intialise the device sockets. */
    dev0 = test_socket (AF_SP_RAW, NN_REP);
    test_bind (dev0, socket_address_h);
    dev1 = test_socket (AF_SP_RAW, NN_REQ);
    test_bind (dev1, SOCKET_ADDRESS_I);

    /*  Run the device. */
    rc = nn_device (dev0, dev1);
    nn_assert (rc < 0 && nn_errno () == ETERM);

    /*  Clean up. */
    test_close (dev0);
    test_close (dev1);
}